

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:198:29)>
::operator()(Stats *__return_storage_ptr__,
            RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:198:29)>
            *this,string *name,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results
            )

{
  Stats *__src;
  string local_e0;
  Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> local_c0;
  undefined1 local_b8 [8];
  WhenRunner whenRunner;
  string *name_local;
  RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:198:29)>
  *this_local;
  Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results_local;
  
  local_c0.value = results.value;
  whenRunner.whenDepth_ = (size_t)name;
  ::std::__cxx11::string::string((string *)&local_e0,(string *)name);
  WhenRunner::WhenRunner((WhenRunner *)local_b8,local_c0,&local_e0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  WhenRunner::run<__4&>((WhenRunner *)local_b8,(anon_class_1_0_00000001_for_runTest *)this);
  __src = WhenRunner::stats((WhenRunner *)local_b8);
  memcpy(__return_storage_ptr__,__src,0x28);
  WhenRunner::~WhenRunner((WhenRunner *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Stats operator()(const string& name, Out<ContextResultsRecorder> results, Args&&... args) {
            WhenRunner whenRunner(results, name);
            whenRunner.run(runTest, forward<Args>(args)...);

            return whenRunner.stats();
        }